

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scalar_analysis.cpp
# Opt level: O0

Combiner * __thiscall
spvtools::opt::anon_unknown_15::IsGreaterThanZero::GetMulCombiner
          (Combiner *__return_storage_ptr__,IsGreaterThanZero *this)

{
  anon_class_1_0_00000001 local_19;
  IsGreaterThanZero *local_18;
  IsGreaterThanZero *this_local;
  
  local_18 = this;
  this_local = (IsGreaterThanZero *)__return_storage_ptr__;
  std::
  function<spvtools::opt::(anonymous_namespace)::IsGreaterThanZero::Signedness(spvtools::opt::(anonymous_namespace)::IsGreaterThanZero::Signedness,spvtools::opt::(anonymous_namespace)::IsGreaterThanZero::Signedness)>
  ::
  function<spvtools::opt::(anonymous_namespace)::IsGreaterThanZero::GetMulCombiner()const::_lambda(spvtools::opt::(anonymous_namespace)::IsGreaterThanZero::Signedness,spvtools::opt::(anonymous_namespace)::IsGreaterThanZero::Signedness)_1_,void>
            ((function<spvtools::opt::(anonymous_namespace)::IsGreaterThanZero::Signedness(spvtools::opt::(anonymous_namespace)::IsGreaterThanZero::Signedness,spvtools::opt::(anonymous_namespace)::IsGreaterThanZero::Signedness)>
              *)__return_storage_ptr__,&local_19);
  return __return_storage_ptr__;
}

Assistant:

Combiner GetMulCombiner() const {
    return [](Signedness lhs, Signedness rhs) {
      switch (lhs) {
        case Signedness::kPositiveOrNegative:
          break;
        case Signedness::kStrictlyNegative: {
          switch (rhs) {
            case Signedness::kPositiveOrNegative: {
              break;
            }
            case Signedness::kStrictlyNegative: {
              return Signedness::kStrictlyPositive;
            }
            case Signedness::kNegative: {
              return Signedness::kPositive;
            }
            case Signedness::kStrictlyPositive: {
              return Signedness::kStrictlyNegative;
            }
            case Signedness::kPositive: {
              return Signedness::kNegative;
            }
          }
          break;
        }
        case Signedness::kNegative: {
          switch (rhs) {
            case Signedness::kPositiveOrNegative: {
              break;
            }
            case Signedness::kStrictlyNegative:
            case Signedness::kNegative: {
              return Signedness::kPositive;
            }
            case Signedness::kStrictlyPositive:
            case Signedness::kPositive: {
              return Signedness::kNegative;
            }
          }
          break;
        }
        case Signedness::kStrictlyPositive: {
          return rhs;
        }
        case Signedness::kPositive: {
          switch (rhs) {
            case Signedness::kPositiveOrNegative: {
              break;
            }
            case Signedness::kStrictlyNegative:
            case Signedness::kNegative: {
              return Signedness::kNegative;
            }
            case Signedness::kStrictlyPositive:
            case Signedness::kPositive: {
              return Signedness::kPositive;
            }
          }
          break;
        }
      }
      return Signedness::kPositiveOrNegative;
    };
  }